

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O1

int run_test_tty_pty(void)

{
  int iVar1;
  int extraout_EAX;
  uv_handle_t *handle;
  int64_t eval_b_1;
  int64_t eval_b_2;
  int slave_fd;
  int master_fd;
  winsize w;
  uv_tty_t master_tty;
  uv_tty_t slave_tty;
  uv_loop_t loop;
  undefined1 local_588 [32];
  uv_tty_t local_568;
  uv_tty_t local_450;
  uv_loop_t local_338;
  
  handle = (uv_handle_t *)local_588;
  iVar1 = uv_loop_init(&local_338);
  local_568.data = (void *)(long)iVar1;
  local_450.data = (void *)0x0;
  if ((uv__queue *)local_568.data == (uv__queue *)0x0) {
    iVar1 = openpty(local_588 + 0x14,local_588 + 0x10,0,0,local_588 + 0x18);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return 7;
    }
    iVar1 = uv_tty_init(&local_338,&local_450,local_588._16_4_,0);
    local_568.data = (void *)(long)iVar1;
    local_588._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)local_568.data != (uv__queue *)0x0) goto LAB_001d5503;
    iVar1 = uv_tty_init(&local_338,(uv_tty_t *)(local_588 + 0x20),local_588._20_4_,0);
    local_588._0_8_ = SEXT48(iVar1);
    local_588._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_588._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5510;
    iVar1 = uv_is_readable((uv_stream_t *)&local_450);
    if (iVar1 == 0) goto LAB_001d551d;
    iVar1 = uv_is_writable((uv_stream_t *)&local_450);
    if (iVar1 == 0) goto LAB_001d5522;
    iVar1 = uv_is_readable((uv_stream_t *)(local_588 + 0x20));
    if (iVar1 == 0) goto LAB_001d5527;
    iVar1 = uv_is_writable((uv_stream_t *)(local_588 + 0x20));
    if (iVar1 == 0) goto LAB_001d552c;
    local_588._0_8_ = ZEXT48(local_450.flags & 0x100000);
    local_588._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_588._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5531;
    if ((local_568.flags._2_1_ & 0x10) == 0) goto LAB_001d553e;
    iVar1 = close(local_588._16_4_);
    local_588._0_8_ = SEXT48(iVar1);
    local_588._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_588._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5543;
    uv_close((uv_handle_t *)&local_450,(uv_close_cb)0x0);
    iVar1 = close(local_588._20_4_);
    local_588._0_8_ = SEXT48(iVar1);
    local_588._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_588._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5550;
    uv_close((uv_handle_t *)(local_588 + 0x20),(uv_close_cb)0x0);
    iVar1 = uv_run(&local_338,UV_RUN_DEFAULT);
    local_588._0_8_ = SEXT48(iVar1);
    local_588._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_588._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(&local_338,close_walk_cb,(void *)0x0);
      uv_run(&local_338,UV_RUN_DEFAULT);
      local_588._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(&local_338);
      local_588._8_8_ = SEXT48(iVar1);
      if (local_588._0_8_ == local_588._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d556a;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d5503:
    run_test_tty_pty_cold_3();
LAB_001d5510:
    run_test_tty_pty_cold_4();
LAB_001d551d:
    run_test_tty_pty_cold_14();
LAB_001d5522:
    run_test_tty_pty_cold_13();
LAB_001d5527:
    run_test_tty_pty_cold_12();
LAB_001d552c:
    run_test_tty_pty_cold_11();
LAB_001d5531:
    run_test_tty_pty_cold_5();
LAB_001d553e:
    run_test_tty_pty_cold_10();
LAB_001d5543:
    run_test_tty_pty_cold_6();
LAB_001d5550:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d556a:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing(handle);
  if (iVar1 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tty_pty) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif

#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT_OK(uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT_OK(uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT_OK(uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT_OK((slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT_OK(close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT_OK(close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(&loop);
#endif
  return 0;
}